

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_elf32.c
# Opt level: O1

void elf32_dyncreate(GlobalVars *gv,char *pltgot_name)

{
  long lVar1;
  uint32_t uVar2;
  size_t sVar3;
  Section *pSVar4;
  uint8_t *puVar5;
  unsigned_long uVar6;
  Section *relsec;
  Section *relsec_00;
  node *pnVar7;
  uint32_t tag;
  uint be;
  size_t size;
  ulong uVar8;
  bool bVar9;
  
  if (gv->dynobj == (ObjectUnit *)0x0) {
    ierror("%s no dynobj","elf32_dyncreate():");
  }
  if ((gv->soname != (char *)0x0) && (gv->dest_sharedobj != 0)) {
    uVar2 = elf_adddynstr(gv->soname);
    elf32_dynamicentry(gv,0xe,uVar2,(Section *)0x0);
  }
  for (pnVar7 = (gv->rpaths).first; uVar2 = elfdsymlist.nextindex, pnVar7->next != (node *)0x0;
      pnVar7 = pnVar7->next) {
    uVar2 = elf_adddynstr((char *)pnVar7[1].next);
    elf32_dynamicentry(gv,0xf,uVar2,(Section *)0x0);
  }
  bVar9 = elf_endianess == '\x01';
  uVar8 = (ulong)elfdsymlist.nextindex;
  sVar3 = elf_num_buckets(uVar8);
  pSVar4 = find_sect_name(gv->dynobj,".hash");
  if (pSVar4 == (Section *)0x0) {
    ierror("elf32_makehash(): no %s",".hash");
  }
  else {
    size = (sVar3 + uVar8 + 2) * 4;
    pSVar4->size = size;
    puVar5 = (uint8_t *)alloczero(size);
    pSVar4->data = puVar5;
    be = (uint)bVar9;
    write32(be,puVar5,(uint32_t)sVar3);
    write32(be,puVar5 + 4,uVar2);
    if ((elfdsymlist.l.first)->next != (node *)0x0) {
      pnVar7 = elfdsymlist.l.first;
      do {
        uVar6 = elf_hash((char *)pnVar7[2].next);
        lVar1 = (uVar6 % sVar3) * 4 + 8;
        while (uVar2 = read32(be,puVar5 + lVar1), uVar2 != 0) {
          lVar1 = (ulong)uVar2 * 4 + (sVar3 + 2) * 4;
        }
        write32(be,puVar5 + lVar1,*(uint32_t *)&pnVar7[2].pred);
        pnVar7 = pnVar7->next;
      } while (pnVar7->next != (node *)0x0);
    }
  }
  pSVar4 = find_sect_name(gv->dynobj,".dynstr");
  if (pSVar4 == (Section *)0x0) {
    ierror("%s %s missing","elf32_dyncreate():",".dynstr");
  }
  else {
    uVar8 = (ulong)elfdstrlist.nextindex;
    pSVar4->size = uVar8;
    puVar5 = (uint8_t *)alloc(uVar8);
    pSVar4->data = puVar5;
    elf_putstrtab(puVar5,&elfdstrlist);
  }
  relsec = find_sect_name(gv->dynobj,".dynsym");
  if (relsec == (Section *)0x0) {
    ierror("%s %s missing","elf32_dyncreate():",".dynsym");
  }
  else {
    uVar8 = (ulong)elfdsymlist.nextindex;
    relsec->size = uVar8 << 4;
    puVar5 = (uint8_t *)alloc(uVar8 << 4);
    relsec->data = puVar5;
  }
  relsec_00 = find_sect_name(gv->dynobj,".hash");
  elf32_dynamicentry(gv,4,0,relsec_00);
  elf32_dynamicentry(gv,5,0,pSVar4);
  elf32_dynamicentry(gv,6,0,relsec);
  elf32_dynamicentry(gv,10,(uint32_t)pSVar4->size,(Section *)0x0);
  elf32_dynamicentry(gv,0xb,0x10,(Section *)0x0);
  elf32_dynamicentry(gv,0x15,0,(Section *)0x0);
  pSVar4 = find_sect_name(gv->dynobj,pltgot_name);
  if (pSVar4 != (Section *)0x0) {
    elf32_dynamicentry(gv,3,0,pSVar4);
  }
  if (elfpltrelocs != (Section *)0x0) {
    elf32_dynamicentry(gv,2,(uint32_t)elfpltrelocs->size,(Section *)0x0);
    uVar2 = 0x11;
    if (gv->reloctab_format == '\x02') {
      uVar2 = 7;
    }
    elf32_dynamicentry(gv,0x14,uVar2,(Section *)0x0);
    elf32_dynamicentry(gv,0x17,0,elfpltrelocs);
  }
  if (elfdynrelocs != (Section *)0x0) {
    if (gv->reloctab_format == '\x02') {
      elf32_dynamicentry(gv,7,0,elfdynrelocs);
      elf32_dynamicentry(gv,8,(uint32_t)elfdynrelocs->size,(Section *)0x0);
      tag = 9;
      uVar2 = 0xc;
    }
    else {
      elf32_dynamicentry(gv,0x11,0,elfdynrelocs);
      elf32_dynamicentry(gv,0x12,(uint32_t)elfdynrelocs->size,(Section *)0x0);
      tag = 0x13;
      uVar2 = 8;
    }
    elf32_dynamicentry(gv,tag,uVar2,(Section *)0x0);
  }
  elf32_dynamicentry(gv,0,0,(Section *)0x0);
  return;
}

Assistant:

void elf32_dyncreate(struct GlobalVars *gv,const char *pltgot_name)
/* generate .hash, populate .dynstr and .dynamic, allocate .dynsym,
   so that all sections have a valid size for the address calculation */
{
  const char *fn = "elf32_dyncreate():";
  struct Section *dynstr,*dynsym,*pltgot;
  struct LibPath *lpn;

  if (gv->dynobj == NULL)
    ierror("%s no dynobj",fn);

  /* write SONAME and RPATHs */
  if (gv->soname && gv->dest_sharedobj)
    elf32_dynamicentry(gv,DT_SONAME,elf_adddynstr(gv->soname),NULL);
  for (lpn=(struct LibPath *)gv->rpaths.first; lpn->n.next!=NULL;
       lpn=(struct LibPath *)lpn->n.next) {
    elf32_dynamicentry(gv,DT_RPATH,elf_adddynstr(lpn->path),NULL);
  }

  /* generate .hash section */
  elf32_makehash(gv);

  /* allocate and populate .dynstr section */
  if (dynstr = find_sect_name(gv->dynobj,dynstr_name)) {
    dynstr->size = elfdstrlist.nextindex;
    dynstr->data = alloc(dynstr->size);
    elf_putstrtab(dynstr->data,&elfdstrlist);
  }
  else
    ierror("%s %s missing",fn,dynstr_name);

  /* allocate .dynsym section - populate it later, when addresses are fixed */
  if (dynsym = find_sect_name(gv->dynobj,dynsym_name)) {
    dynsym->size = elfdsymlist.nextindex * sizeof(struct Elf32_Sym);
    dynsym->data = alloc(dynsym->size);
  }
  else
    ierror("%s %s missing",fn,dynsym_name);

  /* finish .dynamic section */
  elf32_dynamicentry(gv,DT_HASH,0,find_sect_name(gv->dynobj,hash_name));
  elf32_dynamicentry(gv,DT_STRTAB,0,dynstr);
  elf32_dynamicentry(gv,DT_SYMTAB,0,dynsym);
  elf32_dynamicentry(gv,DT_STRSZ,dynstr->size,NULL);
  elf32_dynamicentry(gv,DT_SYMENT,sizeof(struct Elf32_Sym),NULL);
  elf32_dynamicentry(gv,DT_DEBUG,0,NULL); /* needed? */
  /* do we have a .plt or .got section (target dependant) */
  if (pltgot = find_sect_name(gv->dynobj,pltgot_name)) {
    elf32_dynamicentry(gv,DT_PLTGOT,0,pltgot);    
  }
  /* do we have .plt relocations? */
  if (elfpltrelocs) {
    elf32_dynamicentry(gv,DT_PLTRELSZ,elfpltrelocs->size,NULL);
    elf32_dynamicentry(gv,DT_PLTREL,
                       gv->reloctab_format==RTAB_ADDEND?DT_RELA:DT_REL,
                       NULL);
    elf32_dynamicentry(gv,DT_JMPREL,0,elfpltrelocs);
  }
  /* do we have any other dynamic relocations? */
  if (elfdynrelocs) {
    if (gv->reloctab_format == RTAB_ADDEND) {
      elf32_dynamicentry(gv,DT_RELA,0,elfdynrelocs);
      elf32_dynamicentry(gv,DT_RELASZ,elfdynrelocs->size,NULL);
      elf32_dynamicentry(gv,DT_RELAENT,sizeof(struct Elf32_Rela),NULL);
    }
    else {
      elf32_dynamicentry(gv,DT_REL,0,elfdynrelocs);
      elf32_dynamicentry(gv,DT_RELSZ,elfdynrelocs->size,NULL);
      elf32_dynamicentry(gv,DT_RELENT,sizeof(struct Elf32_Rel),NULL);
    }
  }
  /* end tag */
  elf32_dynamicentry(gv,DT_NULL,0,NULL);
}